

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::showSystemMenu(QMdiSubWindow *this)

{
  long lVar1;
  LayoutDirection LVar2;
  int iVar3;
  QWidget *this_00;
  QPoint QVar4;
  QPoint QVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QPoint local_40;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x308) == 0) || (*(int *)(*(long *)(lVar1 + 0x308) + 4) == 0)) ||
     (*(long *)(lVar1 + 0x310) == 0)) goto LAB_0044f7ea;
  this_00 = maximizedSystemMenuIconWidget(this);
  LVar2 = QWidget::layoutDirection(&this->super_QWidget);
  if (this_00 == (QWidget *)0x0) {
    if (LVar2 == LeftToRight) {
      QVar6 = QWidget::contentsRect(&this->super_QWidget);
      local_40 = QVar6._0_8_;
      this_00 = &this->super_QWidget;
      goto LAB_0044f794;
    }
    QVar6 = QWidget::contentsRect(&this->super_QWidget);
    local_40 = (QPoint)(QVar6._8_8_ & 0xffffffff | QVar6._0_8_ & 0xffffffff00000000);
    QVar4 = QWidget::mapToGlobal(&this->super_QWidget,&local_40);
    QVar5 = (QPoint)((long)QVar4 + 1);
    local_38 = (QPoint)((ulong)QVar5 & 0xffffffff | (ulong)QVar4 & 0xffffffff00000000);
  }
  else {
    if (LVar2 == LeftToRight) {
      iVar3 = QWidget::y(this_00);
      iVar3 = (iVar3 + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
      local_40.xp.m_i = 0;
    }
    else {
      local_40.xp.m_i = ((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1;
      iVar3 = QWidget::y(this_00);
      iVar3 = (iVar3 + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
    }
    local_40.yp.m_i = iVar3 + 1;
LAB_0044f794:
    local_38 = QWidget::mapToGlobal(this_00,&local_40);
    QVar5 = local_38;
  }
  LVar2 = QWidget::layoutDirection(&this->super_QWidget);
  if (LVar2 == RightToLeft) {
    iVar3 = (**(code **)(**(long **)(lVar1 + 0x310) + 0x70))();
    local_38.xp.m_i = QVar5.xp.m_i.m_i - iVar3;
  }
  QMenu::popup(*(QMenu **)(lVar1 + 0x310),&local_38,(QAction *)0x0);
LAB_0044f7ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::showSystemMenu()
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu)
        return;

    QPoint globalPopupPos;
    if (QWidget *icon = maximizedSystemMenuIconWidget()) {
        if (isLeftToRight())
            globalPopupPos = icon->mapToGlobal(QPoint(0, icon->y() + icon->height()));
        else
            globalPopupPos = icon->mapToGlobal(QPoint(icon->width(), icon->y() + icon->height()));
    } else {
        if (isLeftToRight())
            globalPopupPos = mapToGlobal(contentsRect().topLeft());
        else // + QPoint(1, 0) because topRight() == QPoint(left() + width() -1, top())
            globalPopupPos = mapToGlobal(contentsRect().topRight()) + QPoint(1, 0);
    }

    // Adjust x() with -menuwidth in reverse mode.
    if (isRightToLeft())
        globalPopupPos -= QPoint(d->systemMenu->sizeHint().width(), 0);
    d->systemMenu->popup(globalPopupPos);
}